

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.cpp
# Opt level: O3

void trt_pose::parse::assignment_out_k
               (int *connections,float *score_graph,int *topology,int *counts,int K,int M,
               float score_threshold,void *workspace)

{
  int iVar1;
  long lVar2;
  int iVar3;
  
  if (0 < K) {
    iVar3 = 0;
    iVar1 = 0;
    lVar2 = 0;
    do {
      assignment_out(connections + iVar3,score_graph + iVar1,
                     counts[*(int *)((long)topology + lVar2 + 8)],
                     counts[*(int *)((long)topology + lVar2 + 0xc)],M,score_threshold,workspace);
      lVar2 = lVar2 + 0x10;
      iVar1 = iVar1 + M * M;
      iVar3 = iVar3 + M * 2;
    } while ((ulong)(uint)K << 4 != lVar2);
  }
  return;
}

Assistant:

void assignment_out_k(int *connections,         // Kx2xM
                      const float *score_graph, // KxMxM
                      const int *topology,      // Kx4
                      const int *counts,        // C
                      const int K, const int M, const float score_threshold,
                      void *workspace) {
  for (int k = 0; k < K; k++) {
    const int *tk = &topology[k * 4];
    const int cmap_idx_a = tk[2];
    const int cmap_idx_b = tk[3];
    const int count_a = counts[cmap_idx_a];
    const int count_b = counts[cmap_idx_b];
    assignment_out(&connections[k * 2 * M], &score_graph[k * M * M], count_a,
                   count_b, M, score_threshold, workspace);
  }
}